

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_collect_disconnect_stats(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t nsim;
  wchar_t stop_on_disconnect;
  wchar_t local_6c;
  wchar_t local_68 [22];
  
  _Var1 = stats_are_enabled();
  if (!_Var1) {
    return;
  }
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&local_6c);
  if (wVar2 != L'\0') {
    strnfmt((char *)local_68,0x50,"%d",
            (ulong)(uint)do_cmd_wiz_collect_disconnect_stats::default_nsim);
    _Var1 = get_string("Number of simulations: ",(char *)local_68,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string((char *)local_68,&local_6c);
    if (local_6c < L'\x01' || !_Var1) {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"quantity",local_6c);
  }
  do_cmd_wiz_collect_disconnect_stats::default_nsim = local_6c;
  wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",local_68);
  if (wVar2 != L'\0') {
    _Var1 = get_check("Stop if disconnected level found? ");
    local_68[0] = (wchar_t)_Var1;
    cmd_set_arg_choice((command_conflict *)cmd,"choice",local_68[0]);
  }
  disconnect_stats(local_6c,local_68[0] != L'\0');
  return;
}

Assistant:

void do_cmd_wiz_collect_disconnect_stats(struct command *cmd)
{
	/* Record last-used value to be the default in next run. */
	static int default_nsim = 50;
	int nsim, stop_on_disconnect;

	if (!stats_are_enabled()) return;

	if (cmd_get_arg_number(cmd, "quantity", &nsim) != CMD_OK) {
		char s[80];

		/* Set default. */
		strnfmt(s, sizeof(s), "%d", default_nsim);

		if (!get_string("Number of simulations: ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &nsim) || nsim < 1) return;
		cmd_set_arg_number(cmd, "quantity", nsim);
	}
	default_nsim = nsim;

	if (cmd_get_arg_choice(cmd, "choice", &stop_on_disconnect) != CMD_OK) {
		stop_on_disconnect =
			get_check("Stop if disconnected level found? ") ? 1 : 0;
		cmd_set_arg_choice(cmd, "choice", stop_on_disconnect);
	}

	disconnect_stats(nsim, stop_on_disconnect != 0);
}